

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O0

void __thiscall Abstract<4U>::Abstract(Abstract<4U> *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR_Init_00123b60;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 9));
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[6] = 0;
  in_RDI[5] = 0;
  return;
}

Assistant:

Abstract() { pr = cr = are = aae = 0; }